

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

Statement * __thiscall slang::ast::ProceduralBlockSymbol::getBody(ProceduralBlockSymbol *this)

{
  int iVar1;
  Symbol *symbol;
  undefined4 extraout_var;
  uint32_t uVar2;
  ProceduralBlockSymbol *in_RDI;
  LookupLocation LVar3;
  StatementContext stmtCtx;
  ASTContext context;
  Scope *scope;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_BlockSymbols_cpp:364:33)>
  guard;
  ASTContext *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  Symbol *pSVar4;
  pointer local_d8;
  size_t sStack_d0;
  StatementContext *in_stack_ffffffffffffff40;
  bitmask<slang::ast::ASTFlags> local_a0;
  bitmask<slang::ast::ASTFlags> local_98;
  Scope *local_90;
  uint32_t local_88;
  Scope *local_80;
  uint32_t local_78;
  ASTContext local_70;
  Symbol *local_28;
  anon_class_8_1_8991fb9c_for_func local_20;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_BlockSymbols_cpp:364:33)>
  local_18;
  bitmask<slang::ast::ASTFlags> flags;
  
  if (in_RDI->stmt == (Statement *)0x0) {
    in_RDI->isConstructing = true;
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/BlockSymbols.cpp:364:33)>
    ::ScopeGuard(&local_18,&local_20);
    symbol = (Symbol *)Symbol::getParentScope(&in_RDI->super_Symbol);
    pSVar4 = symbol;
    local_28 = symbol;
    LVar3 = LookupLocation::after(symbol);
    flags.m_bits = (underlying_type)LVar3.scope;
    uVar2 = LVar3.index;
    local_90 = (Scope *)flags.m_bits;
    local_88 = uVar2;
    local_80 = (Scope *)flags.m_bits;
    local_78 = uVar2;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_98,None);
    LVar3._8_8_ = in_RDI;
    LVar3.scope = (Scope *)pSVar4;
    ASTContext::ASTContext
              ((ASTContext *)CONCAT44(uVar2,in_stack_ffffffffffffff08),(Scope *)symbol,LVar3,flags);
    ASTContext::setProceduralBlock(&local_70,in_RDI);
    if (in_RDI->procedureKind == Final) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,Final);
      bitmask<slang::ast::ASTFlags>::operator|=(&local_70.flags,&local_a0);
    }
    Statement::StatementContext::StatementContext
              ((StatementContext *)symbol,in_stack_fffffffffffffef8);
    local_d8 = (in_RDI->blocks)._M_ptr;
    sStack_d0 = (in_RDI->blocks)._M_extent._M_extent_value;
    iVar1 = Statement::bind((int)in_RDI->stmtSyntax,(sockaddr *)&local_70,(socklen_t)&local_d8);
    in_RDI->stmt = (Statement *)CONCAT44(extraout_var,iVar1);
    Statement::StatementContext::~StatementContext(in_stack_ffffffffffffff40);
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/BlockSymbols.cpp:364:33)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_BlockSymbols_cpp:364:33)>
                   *)symbol);
  }
  return in_RDI->stmt;
}

Assistant:

const Statement& ProceduralBlockSymbol::getBody() const {
    if (!stmt) {
        SLANG_ASSERT(!isConstructing);

        isConstructing = true;
        auto guard = ScopeGuard([this] { isConstructing = false; });

        auto scope = getParentScope();
        SLANG_ASSERT(scope && stmtSyntax);

        ASTContext context(*scope, LookupLocation::after(*this));
        context.setProceduralBlock(*this);

        if (procedureKind == ProceduralBlockKind::Final)
            context.flags |= ASTFlags::Final;

        Statement::StatementContext stmtCtx(context);
        stmtCtx.blocks = blocks;

        stmt = &Statement::bind(*stmtSyntax, context, stmtCtx);
    }
    return *stmt;
}